

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigs.c
# Opt level: O0

int initOpts(int argc,char **argv)

{
  int iVar1;
  char **in_RSI;
  int in_EDI;
  int args;
  int opt;
  int local_18;
  
  _opterr = 0;
  local_18 = 1;
  while( true ) {
    iVar1 = getopt(in_EDI,in_RSI,"ax");
    if (iVar1 == -1) break;
    if (iVar1 == 0x61) {
      printFlags = printFlags | 2;
    }
    else if (iVar1 == 0x78) {
      printFlags = printFlags | 1;
    }
    else {
      report(0xfe,"ERROR: bad option %c",(ulong)_optopt);
    }
    local_18 = local_18 + 1;
  }
  return local_18;
}

Assistant:

static int initOpts(int argc, char *argv[])
{
   int opt, args;

   opterr = 0;

   args = 1;

   while ((opt = getopt(argc, argv, "ax")) != -1)
   {
      switch (opt)
      {
         case 'a':
            printFlags |= PRINT_ASCII;
            args++;
            break;

         case 'x':
            printFlags |= PRINT_HEX;
            args++;
            break;

         default:
            args++;
            report(PIGS_OPTION_ERR, "ERROR: bad option %c", optopt);
      }
    }
   return args;
}